

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProfiler.cpp
# Opt level: O3

bool __thiscall chrono::utils::ChProfileNode::Return(ChProfileNode *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  
  iVar2 = this->RecursionCounter + -1;
  this->RecursionCounter = iVar2;
  if ((iVar2 == 0) && (this->TotalCalls != 0)) {
    lVar3 = std::chrono::_V2::system_clock::now();
    auVar4._8_56_ = extraout_var;
    auVar4._0_8_ = extraout_XMM0_Qa;
    auVar1 = vcvtusi2ss_avx512f(auVar4._0_16_,(lVar3 - gProfileClock._0_8_) / 1000 - this->StartTime
                               );
    this->TotalTime = auVar1._0_4_ / 1000.0 + this->TotalTime;
    iVar2 = this->RecursionCounter;
  }
  return iVar2 == 0;
}

Assistant:

bool	ChProfileNode::Return( void )
{
	if ( --RecursionCounter == 0 && TotalCalls != 0 ) { 
		unsigned long int time;
		Profile_Get_Ticks(&time);
		time-=StartTime;
		TotalTime += (float)time / Profile_Get_Tick_Rate();
	}
	return ( RecursionCounter == 0 );
}